

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void patchlistaux(FuncState *fs,int list,int vtarget,int reg,int dtarget)

{
  int iVar1;
  int iVar2;
  int dest;
  
  while (list != -1) {
    iVar1 = getjump(fs,list);
    iVar2 = patchtestreg(fs,list,reg);
    dest = vtarget;
    if (iVar2 == 0) {
      dest = dtarget;
    }
    fixjump(fs,list,dest);
    list = iVar1;
  }
  return;
}

Assistant:

static void patchlistaux(FuncState *fs, int list, int vtarget, int reg,
                         int dtarget) {
    while (list != NO_JUMP) {
        int next = getjump(fs, list);
        if (patchtestreg(fs, list, reg))
            fixjump(fs, list, vtarget);
        else
            fixjump(fs, list, dtarget);  /* jump to default target */
        list = next;
    }
}